

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O2

void __thiscall CMapLayers::LoadBackgroundMap(CMapLayers *this)

{
  long lVar1;
  IConsole *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  CMapImages *this_00;
  char *pcVar6;
  char *a;
  char *pcVar7;
  long in_FS_OFFSET;
  char aBuf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  a = ((this->super_CComponent).m_pClient)->m_pConfig->m_ClMenuMap;
  iVar3 = str_comp(a,"auto");
  if (iVar3 == 0) {
    uVar4 = time_season();
    if (uVar4 < 4) {
      a = &DAT_001ca0a0 + *(int *)(&DAT_001ca0a0 + (ulong)uVar4 * 4);
    }
  }
  iVar3 = time_houroftheday();
  pcVar7 = "day";
  pcVar6 = "night";
  if (iVar3 - 6U < 0xc) {
    pcVar6 = "day";
  }
  str_format(aBuf,0x80,"ui/themes/%s_%s.map",a,pcVar6);
  iVar5 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[9])
                    (this->m_pMenuMap,aBuf,((this->super_CComponent).m_pClient)->m_pStorage);
  if ((char)iVar5 == '\0') {
    str_format(aBuf,0x80,"ui/themes/%s.map",a);
    iVar5 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[9])
                      (this->m_pMenuMap,aBuf,((this->super_CComponent).m_pClient)->m_pStorage);
    if ((char)iVar5 == '\0') {
      if (iVar3 - 6U < 0xc) {
        pcVar7 = "night";
      }
      str_format(aBuf,0x80,"ui/themes/%s_%s.map",a,pcVar7);
      iVar3 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[9])
                        (this->m_pMenuMap,aBuf,((this->super_CComponent).m_pClient)->m_pStorage);
      if ((char)iVar3 == '\0') {
        str_format(aBuf,0x80,"map \'%s\' not found",a);
        pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
        (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])(pIVar2,1,"client",aBuf,0);
        goto LAB_00140b86;
      }
    }
  }
  str_format(aBuf,0x80,"loaded map \'%s\'",a);
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])(pIVar2,1,"client",aBuf,0);
  CLayers::Init(this->m_pMenuLayers,
                (((this->super_CComponent).m_pClient)->super_IGameClient).super_IInterface.m_pKernel
                ,&this->m_pMenuMap->super_IMap);
  this_00 = ((this->super_CComponent).m_pClient)->m_pMapimages;
  CMapImages::OnMenuMapLoad(this_00,&this->m_pMenuMap->super_IMap);
  LoadEnvPoints((CMapLayers *)this_00,this->m_pMenuLayers,&this->m_lEnvPointsMenu);
LAB_00140b86:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CMapLayers::LoadBackgroundMap()
{
	const char *pMenuMap = Config()->m_ClMenuMap;
	if(str_comp(pMenuMap, "auto") == 0)
	{
		switch(time_season())
		{
			case SEASON_SPRING:
				pMenuMap = "heavens";
				break;
			case SEASON_SUMMER:
				pMenuMap = "jungle";
				break;
			case SEASON_AUTUMN:
				pMenuMap = "autumn";
				break;
			case SEASON_WINTER:
				pMenuMap = "winter";
				break;
		}
	}

	const int HourOfTheDay = time_houroftheday();
	const bool IsDaytime = HourOfTheDay >= 6 && HourOfTheDay < 18;

	char aBuf[128];
	// check for the appropriate day/night map
	str_format(aBuf, sizeof(aBuf), "ui/themes/%s_%s.map", pMenuMap, IsDaytime ? "day" : "night");
	if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
	{
		// fall back on generic map
		str_format(aBuf, sizeof(aBuf), "ui/themes/%s.map", pMenuMap);
		if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
		{
			// fall back on day/night alternative map
			str_format(aBuf, sizeof(aBuf), "ui/themes/%s_%s.map", pMenuMap, IsDaytime ? "night" : "day");
			if(!m_pMenuMap->Load(aBuf, m_pClient->Storage()))
			{
				str_format(aBuf, sizeof(aBuf), "map '%s' not found", pMenuMap);
				Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
				return;
			}
		}
	}

	str_format(aBuf, sizeof(aBuf), "loaded map '%s'", pMenuMap);
	Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);

	m_pMenuLayers->Init(Kernel(), m_pMenuMap);
	m_pClient->m_pMapimages->OnMenuMapLoad(m_pMenuMap);
	LoadEnvPoints(m_pMenuLayers, m_lEnvPointsMenu);
}